

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O2

int main(int argc,char **argv)

{
  int busy_waiting;
  int connection;
  Arguments args;
  Arguments AStack_28;
  
  busy_waiting = check_flag("busy",argc,argv);
  parse_arguments(&AStack_28,argc,argv);
  connection = create_connection(busy_waiting);
  communicate(connection,&AStack_28,busy_waiting);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	// File descriptor for the socket over which
	// the communciation will happen with the client
	int connection;

	// Flag to determine whether or not to
	// do busy-waiting and non-blocking calls
	int busy_waiting;

	// For command-line arguments
	struct Arguments args;

	busy_waiting = check_flag("busy", argc, argv);
	parse_arguments(&args, argc, argv);

	connection = create_connection(busy_waiting);
	communicate(connection, &args, busy_waiting);

	return EXIT_SUCCESS;
}